

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

ConstString * __thiscall Clasp::ConstString::operator=(ConstString *this,ConstString *rhs)

{
  ConstString *in_RDI;
  ConstString temp;
  ConstString *in_stack_ffffffffffffffd8;
  
  ConstString(in_RDI,in_stack_ffffffffffffffd8);
  swap(in_RDI,in_stack_ffffffffffffffd8);
  ~ConstString((ConstString *)0x1d3050);
  return in_RDI;
}

Assistant:

ConstString& ConstString::operator=(const ConstString& rhs) {
	ConstString temp(rhs);
	swap(temp);
	return *this;
}